

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestPackWithCustomTypeUrl_Test::TestBody
          (AnyTest_TestPackWithCustomTypeUrl_Test *this)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_190;
  Message local_188;
  int32_t local_180;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_90 [8];
  Any any;
  undefined1 local_58 [8];
  TestAny submessage;
  AnyTest_TestPackWithCustomTypeUrl_Test *this_local;
  
  submessage.field_0._48_8_ = this;
  proto2_unittest::TestAny::TestAny((TestAny *)local_58);
  proto2_unittest::TestAny::set_int32_value((TestAny *)local_58,0x3039);
  Any::Any((Any *)local_90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "type.myservice.com");
  Any::PackFrom((Any *)local_90,(Message *)local_58,stack0xffffffffffffff60);
  psVar2 = Any::type_url_abi_cxx11_((Any *)local_90);
  testing::internal::EqHelper::
  Compare<char[43],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b0,"\"type.myservice.com/proto2_unittest.TestAny\"","any.type_url()",
             (char (*) [43])"type.myservice.com/proto2_unittest.TestAny",psVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_1.message_,
             "type.myservice.com/");
  Any::PackFrom((Any *)local_90,(Message *)local_58,stack0xffffffffffffff30);
  psVar2 = Any::type_url_abi_cxx11_((Any *)local_90);
  testing::internal::EqHelper::
  Compare<char[43],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e0,"\"type.myservice.com/proto2_unittest.TestAny\"","any.type_url()",
             (char (*) [43])"type.myservice.com/proto2_unittest.TestAny",psVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_2.message_,
             anon_var_dwarf_37cdd0 + 5);
  Any::PackFrom((Any *)local_90,(Message *)local_58,stack0xffffffffffffff00);
  psVar2 = Any::type_url_abi_cxx11_((Any *)local_90);
  testing::internal::EqHelper::
  Compare<char[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_110,"\"/proto2_unittest.TestAny\"","any.type_url()",
             (char (*) [25])0x1cdd4c9,psVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  proto2_unittest::TestAny::Clear((TestAny *)local_58);
  local_131 = Any::UnpackTo((Any *)local_90,(Message *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_130,
               (AssertionResult *)"any.UnpackTo(&submessage)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_17c = 0x3039;
  local_180 = proto2_unittest::TestAny::int32_value((TestAny *)local_58);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_178,"12345","submessage.int32_value()",&local_17c,&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  Any::~Any((Any *)local_90);
  proto2_unittest::TestAny::~TestAny((TestAny *)local_58);
  return;
}

Assistant:

TEST(AnyTest, TestPackWithCustomTypeUrl) {
  proto2_unittest::TestAny submessage;
  submessage.set_int32_value(12345);
  google::protobuf::Any any;
  // Pack with a custom type URL prefix.
  any.PackFrom(submessage, "type.myservice.com");
  EXPECT_EQ("type.myservice.com/proto2_unittest.TestAny", any.type_url());
  // Pack with a custom type URL prefix ending with '/'.
  any.PackFrom(submessage, "type.myservice.com/");
  EXPECT_EQ("type.myservice.com/proto2_unittest.TestAny", any.type_url());
  // Pack with an empty type URL prefix.
  any.PackFrom(submessage, "");
  EXPECT_EQ("/proto2_unittest.TestAny", any.type_url());

  // Test unpacking the type.
  submessage.Clear();
  EXPECT_TRUE(any.UnpackTo(&submessage));
  EXPECT_EQ(12345, submessage.int32_value());
}